

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

void al_replace_path_component(ALLEGRO_PATH *path,int i,char *s)

{
  undefined8 *puVar1;
  
  if (i < 0) {
    i = i + (int)(path->segments)._size;
  }
  puVar1 = (undefined8 *)_al_vector_ref(&path->segments,i);
  al_ustr_assign_cstr((ALLEGRO_USTR *)*puVar1,s);
  return;
}

Assistant:

void al_replace_path_component(ALLEGRO_PATH *path, int i, const char *s)
{
   ASSERT(path);
   ASSERT(s);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   al_ustr_assign_cstr(get_segment(path, i), s);
}